

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageFormat(Image *image,int newFormat)

{
  ushort uVar1;
  int iVar2;
  void *__ptr;
  void *pvVar3;
  undefined4 *puVar4;
  float *pfVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pvVar3 = image->data;
  if ((((pvVar3 != (void *)0x0) && (image->width != 0)) && (newFormat != 0 && image->height != 0))
     && (iVar2 = image->format, iVar2 != newFormat)) {
    if (10 < newFormat || 10 < iVar2) {
      TraceLog(4,"IMAGE: Data format is compressed, can not be converted");
      return;
    }
    uVar7 = image->height * image->width;
    __ptr = malloc((long)(int)uVar7 << 4);
    if (0 < (int)uVar7) {
      pfVar5 = (float *)((long)__ptr + 0xc);
      uVar6 = 0;
      iVar8 = 0;
      do {
        switch(iVar2) {
        case 1:
          fVar13 = (float)*(byte *)((long)pvVar3 + uVar6) / 255.0;
          pfVar5[-3] = fVar13;
          pfVar5[-2] = fVar13;
          pfVar5[-1] = fVar13;
          goto LAB_0013f0ed;
        case 2:
          fVar13 = (float)*(byte *)((long)pvVar3 + (long)iVar8) / 255.0;
          pfVar5[-3] = fVar13;
          pfVar5[-2] = fVar13;
          pfVar5[-1] = fVar13;
          *pfVar5 = (float)*(byte *)((long)pvVar3 + (long)iVar8 + 1) / 255.0;
          iVar8 = iVar8 + 2;
          break;
        case 3:
          uVar1 = *(ushort *)((long)pvVar3 + uVar6 * 2);
          pfVar5[-3] = (float)(uVar1 >> 0xb) * 0.032258064;
          pfVar5[-2] = (float)(uVar1 >> 5 & 0x3f) * 0.015873017;
          pfVar5[-1] = (float)(uVar1 & 0x1f) * 0.032258064;
          goto LAB_0013f0ed;
        case 4:
          lVar9 = (long)iVar8;
          pfVar5[-3] = (float)*(byte *)((long)pvVar3 + lVar9) / 255.0;
          pfVar5[-2] = (float)*(byte *)((long)pvVar3 + lVar9 + 1) / 255.0;
          fVar13 = (float)*(byte *)((long)pvVar3 + lVar9 + 2) / 255.0;
          goto LAB_0013f22a;
        case 5:
          uVar1 = *(ushort *)((long)pvVar3 + uVar6 * 2);
          pfVar5[-3] = (float)(uVar1 >> 0xb) * 0.032258064;
          pfVar5[-2] = (float)(uVar1 >> 6 & 0x1f) * 0.032258064;
          pfVar5[-1] = (float)(uVar1 >> 1 & 0x1f) * 0.032258064;
          fVar13 = 0.0;
          if ((uVar1 & 1) != 0) {
            fVar13 = 1.0;
          }
          *pfVar5 = fVar13;
          break;
        case 6:
          uVar1 = *(ushort *)((long)pvVar3 + uVar6 * 2);
          pfVar5[-3] = (float)(uVar1 >> 0xc) * 0.06666667;
          pfVar5[-2] = (float)(uVar1 >> 8 & 0xf) * 0.06666667;
          pfVar5[-1] = (float)(uVar1 >> 4 & 0xf) * 0.06666667;
          *pfVar5 = (float)(uVar1 & 0xf) * 0.06666667;
          break;
        case 7:
          lVar9 = (long)iVar8;
          pfVar5[-3] = (float)*(byte *)((long)pvVar3 + lVar9) / 255.0;
          pfVar5[-2] = (float)*(byte *)((long)pvVar3 + lVar9 + 1) / 255.0;
          pfVar5[-1] = (float)*(byte *)((long)pvVar3 + lVar9 + 2) / 255.0;
          fVar13 = (float)*(byte *)((long)pvVar3 + lVar9 + 3) / 255.0;
          goto LAB_0013f200;
        case 8:
          pfVar5[-3] = *(float *)((long)pvVar3 + (long)iVar8 * 4);
          pfVar5[-2] = 0.0;
          pfVar5[-1] = 0.0;
LAB_0013f0ed:
          *pfVar5 = 1.0;
          break;
        case 9:
          lVar9 = (long)iVar8;
          pfVar5[-3] = *(float *)((long)pvVar3 + lVar9 * 4);
          pfVar5[-2] = *(float *)((long)pvVar3 + lVar9 * 4 + 4);
          fVar13 = *(float *)((long)pvVar3 + lVar9 * 4 + 8);
LAB_0013f22a:
          pfVar5[-1] = fVar13;
          *pfVar5 = 1.0;
          iVar8 = iVar8 + 3;
          break;
        case 10:
          lVar9 = (long)iVar8;
          pfVar5[-3] = *(float *)((long)pvVar3 + lVar9 * 4);
          pfVar5[-2] = *(float *)((long)pvVar3 + lVar9 * 4 + 4);
          pfVar5[-1] = *(float *)((long)pvVar3 + lVar9 * 4 + 8);
          fVar13 = *(float *)((long)pvVar3 + lVar9 * 4 + 0xc);
LAB_0013f200:
          *pfVar5 = fVar13;
          iVar8 = iVar8 + 4;
        }
        uVar6 = uVar6 + 1;
        pfVar5 = pfVar5 + 4;
      } while (uVar7 != uVar6);
    }
    free(image->data);
    image->data = (void *)0x0;
    image->format = newFormat;
    switch(newFormat) {
    case 1:
      iVar2 = image->height * image->width;
      pvVar3 = malloc((long)iVar2);
      image->data = pvVar3;
      if (0 < iVar2) {
        pfVar5 = (float *)((long)__ptr + 8);
        lVar9 = 0;
        do {
          *(char *)((long)image->data + lVar9) =
               (char)(int)((*pfVar5 * 0.114 + pfVar5[-2] * 0.299 + pfVar5[-1] * 0.587) * 255.0);
          lVar9 = lVar9 + 1;
          pfVar5 = pfVar5 + 4;
        } while (lVar9 < (long)image->height * (long)image->width);
      }
      break;
    case 2:
      pvVar3 = malloc((long)(image->width * image->height * 2));
      image->data = pvVar3;
      if (0 < image->width * image->height * 2) {
        lVar9 = 0;
        do {
          *(char *)((long)image->data + lVar9) =
               (char)(int)((*(float *)((long)__ptr + lVar9 * 8 + 8) * 0.114 +
                           *(float *)((long)__ptr + lVar9 * 8) * 0.299 +
                           *(float *)((long)__ptr + lVar9 * 8 + 4) * 0.587) * 255.0);
          *(char *)((long)image->data + lVar9 + 1) =
               (char)(int)(*(float *)((long)__ptr + lVar9 * 8 + 0xc) * 255.0);
          lVar9 = lVar9 + 2;
        } while (lVar9 < image->width * image->height * 2);
      }
      break;
    case 3:
      pvVar3 = malloc((long)image->height * (long)image->width * 2);
      image->data = pvVar3;
      if (0 < image->height * image->width) {
        pfVar5 = (float *)((long)__ptr + 8);
        lVar9 = 0;
        do {
          fVar13 = roundf(pfVar5[-2] * 31.0);
          fVar10 = roundf(pfVar5[-1] * 63.0);
          fVar11 = roundf(*pfVar5 * 31.0);
          *(ushort *)((long)image->data + lVar9 * 2) =
               (ushort)(int)fVar11 & 0xff | (ushort)((int)fVar13 << 0xb) |
               (ushort)(((int)fVar10 & 0xffU) << 5);
          lVar9 = lVar9 + 1;
          pfVar5 = pfVar5 + 4;
        } while (lVar9 < (long)image->height * (long)image->width);
      }
      break;
    case 4:
      pvVar3 = malloc((long)(image->width * image->height * 3));
      image->data = pvVar3;
      if (0 < image->width * image->height * 3) {
        pfVar5 = (float *)((long)__ptr + 8);
        lVar9 = 0;
        do {
          *(char *)((long)image->data + lVar9) = (char)(int)(pfVar5[-2] * 255.0);
          *(char *)((long)image->data + lVar9 + 1) = (char)(int)(pfVar5[-1] * 255.0);
          *(char *)((long)image->data + lVar9 + 2) = (char)(int)(*pfVar5 * 255.0);
          lVar9 = lVar9 + 3;
          pfVar5 = pfVar5 + 4;
        } while (lVar9 < image->width * image->height * 3);
      }
      break;
    case 5:
      pvVar3 = malloc((long)image->height * (long)image->width * 2);
      image->data = pvVar3;
      if (0 < image->height * image->width) {
        pfVar5 = (float *)((long)__ptr + 0xc);
        lVar9 = 0;
        do {
          fVar13 = roundf(pfVar5[-3] * 31.0);
          fVar10 = roundf(pfVar5[-2] * 31.0);
          fVar11 = roundf(pfVar5[-1] * 31.0);
          *(ushort *)((long)image->data + lVar9 * 2) =
               (ushort)(0.19607843 < *pfVar5) | (ushort)((int)fVar13 << 0xb) |
               (ushort)(((int)fVar10 & 0xffU) << 6) | ((ushort)(int)fVar11 & 0xff) * 2;
          lVar9 = lVar9 + 1;
          pfVar5 = pfVar5 + 4;
        } while (lVar9 < (long)image->height * (long)image->width);
      }
      break;
    case 6:
      pvVar3 = malloc((long)image->height * (long)image->width * 2);
      image->data = pvVar3;
      if (0 < image->height * image->width) {
        pfVar5 = (float *)((long)__ptr + 0xc);
        lVar9 = 0;
        do {
          fVar13 = roundf(pfVar5[-3] * 15.0);
          fVar10 = roundf(pfVar5[-2] * 15.0);
          fVar11 = roundf(pfVar5[-1] * 15.0);
          fVar12 = roundf(*pfVar5 * 15.0);
          *(ushort *)((long)image->data + lVar9 * 2) =
               (ushort)(int)fVar12 & 0xff |
               (ushort)(((int)fVar11 & 0xffU) << 4) |
               (ushort)((int)fVar10 << 8) | (ushort)((int)fVar13 << 0xc);
          lVar9 = lVar9 + 1;
          pfVar5 = pfVar5 + 4;
        } while (lVar9 < (long)image->height * (long)image->width);
      }
      break;
    case 7:
      pvVar3 = malloc((long)(image->width * image->height * 4));
      image->data = pvVar3;
      if (0 < image->width * image->height * 4) {
        lVar9 = 0;
        do {
          *(char *)((long)image->data + lVar9) =
               (char)(int)(*(float *)((long)__ptr + lVar9 * 4) * 255.0);
          *(char *)((long)image->data + lVar9 + 1) =
               (char)(int)(*(float *)((long)__ptr + lVar9 * 4 + 4) * 255.0);
          *(char *)((long)image->data + lVar9 + 2) =
               (char)(int)(*(float *)((long)__ptr + lVar9 * 4 + 8) * 255.0);
          *(char *)((long)image->data + lVar9 + 3) =
               (char)(int)(*(float *)((long)__ptr + lVar9 * 4 + 0xc) * 255.0);
          lVar9 = lVar9 + 4;
        } while (lVar9 < image->width * image->height * 4);
      }
      break;
    case 8:
      pvVar3 = malloc((long)image->height * (long)image->width * 4);
      image->data = pvVar3;
      if (0 < image->height * image->width) {
        pfVar5 = (float *)((long)__ptr + 8);
        lVar9 = 0;
        do {
          *(float *)((long)image->data + lVar9 * 4) =
               *pfVar5 * 0.114 + pfVar5[-2] * 0.299 + pfVar5[-1] * 0.587;
          lVar9 = lVar9 + 1;
          pfVar5 = pfVar5 + 4;
        } while (lVar9 < (long)image->height * (long)image->width);
      }
      break;
    case 9:
      pvVar3 = malloc((long)(image->width * image->height * 3) << 2);
      image->data = pvVar3;
      if (0 < image->width * image->height * 3) {
        puVar4 = (undefined4 *)((long)__ptr + 8);
        lVar9 = 0;
        do {
          *(undefined4 *)((long)image->data + lVar9 * 4) = puVar4[-2];
          *(undefined4 *)((long)image->data + lVar9 * 4 + 4) = puVar4[-1];
          *(undefined4 *)((long)image->data + lVar9 * 4 + 8) = *puVar4;
          lVar9 = lVar9 + 3;
          puVar4 = puVar4 + 4;
        } while (lVar9 < image->width * image->height * 3);
      }
      break;
    case 10:
      pvVar3 = malloc((long)(image->width * image->height * 4) << 2);
      image->data = pvVar3;
      if (0 < image->width * image->height * 4) {
        lVar9 = 0;
        do {
          *(undefined4 *)((long)image->data + lVar9 * 4) = *(undefined4 *)((long)__ptr + lVar9 * 4);
          *(undefined4 *)((long)image->data + lVar9 * 4 + 4) =
               *(undefined4 *)((long)__ptr + lVar9 * 4 + 4);
          *(undefined4 *)((long)image->data + lVar9 * 4 + 8) =
               *(undefined4 *)((long)__ptr + lVar9 * 4 + 8);
          *(undefined4 *)((long)image->data + lVar9 * 4 + 0xc) =
               *(undefined4 *)((long)__ptr + lVar9 * 4 + 0xc);
          lVar9 = lVar9 + 4;
        } while (lVar9 < image->width * image->height * 4);
      }
    }
    free(__ptr);
    if ((1 < image->mipmaps) && (image->mipmaps = 1, image->data != (void *)0x0)) {
      ImageMipmaps(image);
      return;
    }
  }
  return;
}

Assistant:

void ImageFormat(Image *image, int newFormat)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if ((newFormat != 0) && (image->format != newFormat))
    {
        if ((image->format < PIXELFORMAT_COMPRESSED_DXT1_RGB) && (newFormat < PIXELFORMAT_COMPRESSED_DXT1_RGB))
        {
            Vector4 *pixels = LoadImageDataNormalized(*image);     // Supports 8 to 32 bit per channel

            RL_FREE(image->data);      // WARNING! We loose mipmaps data --> Regenerated at the end...
            image->data = NULL;
            image->format = newFormat;

            int k = 0;

            switch (image->format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f)*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*2*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height*2; i += 2, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[k].x*0.299f + (float)pixels[k].y*0.587f + (float)pixels[k].z*0.114f)*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].w*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*63.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*3*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*31.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));
                        a = (pixels[i].w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*15.0f));
                        g = (unsigned char)(round(pixels[i].y*15.0f));
                        b = (unsigned char)(round(pixels[i].z*15.0f));
                        a = (unsigned char)(round(pixels[i].w*15.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*4*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                        ((unsigned char *)image->data)[i + 3] = (unsigned char)(pixels[k].w*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    // WARNING: Image is converted to GRAYSCALE eqeuivalent 32bit

                    image->data = (float *)RL_MALLOC(image->width*image->height*sizeof(float));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((float *)image->data)[i] = (float)(pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*3*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*4*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                        ((float *)image->data)[i + 3] = pixels[k].w;
                    }
                } break;
                default: break;
            }

            RL_FREE(pixels);
            pixels = NULL;

            // In case original image had mipmaps, generate mipmaps for formated image
            // NOTE: Original mipmaps are replaced by new ones, if custom mipmaps were used, they are lost
            if (image->mipmaps > 1)
            {
                image->mipmaps = 1;
            #if defined(SUPPORT_IMAGE_MANIPULATION)
                if (image->data != NULL) ImageMipmaps(image);
            #endif
            }
        }
        else TRACELOG(LOG_WARNING, "IMAGE: Data format is compressed, can not be converted");
    }
}